

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

void __thiscall rlib::JsonT<void>::clear(JsonT<void> *this)

{
  long *plVar1;
  Type TVar2;
  
  TVar2 = this->m_type;
  if (TVar2 == Map) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                 *)&(this->field_1).m_string);
  }
  else if (TVar2 == Array) {
    std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::~vector
              ((vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
               &(this->field_1).m_string);
  }
  else if (TVar2 == String) {
    plVar1 = (long *)((long)&this->field_1 + 0x10);
    if ((long *)(this->field_1).m_int != plVar1) {
      operator_delete((long *)(this->field_1).m_int,*plVar1 + 1);
    }
  }
  this->m_type = Null;
  return;
}

Assistant:

void clear() {
			typedef std::string TypeString;
			switch (m_type) {
			case Type::String:	m_string.~TypeString();	break;
			case Type::Array:	m_array.~Array();		break;
			case Type::Map:		m_map.~Map();			break;
			default:		break;
			}
			m_type = Type::Null;
		}